

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void __thiscall ncnn::Mat::substract_mean_normalize(Mat *this,float *mean_vals,float *norm_vals)

{
  float fVar1;
  Layer *pLVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ParamDict pd;
  Mat local_100;
  Option opt;
  Mat MStack_70;
  
  if (norm_vals == (float *)0x0 && mean_vals != (float *)0x0) {
    pLVar2 = create_layer(3);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,this->c);
    (*pLVar2->_vptr_Layer[2])(pLVar2,&pd);
    opt.lightmode = false;
    opt._1_3_ = 0;
    opt.num_threads = 0;
    opt.blob_allocator._0_4_ = 0;
    opt.blob_allocator._4_4_ = 0;
    opt.workspace_allocator._0_4_ = 0;
    opt._20_8_ = 0;
    opt.use_bf16_storage = false;
    opt.use_fp16_packed = false;
    opt.use_fp16_storage = false;
    opt.use_fp16_arithmetic = false;
    opt.use_int8_packed = false;
    opt.use_int8_storage = false;
    opt.use_int8_arithmetic = false;
    opt.use_packing_layout = false;
    opt.use_shader_pack8 = false;
    opt.use_subgroup_basic = false;
    opt.use_subgroup_vote = false;
    opt.use_subgroup_ballot = false;
    opt.use_subgroup_shuffle = false;
    opt.use_image_storage = false;
    opt.use_tensor_storage = false;
    opt.use_weight_fp16_storage = false;
    opt.flush_denormals = 0;
    opt.use_local_pool_allocator = false;
    opt.use_reserved_1 = false;
    opt.use_reserved_2 = false;
    opt.use_reserved_3 = false;
    opt.use_reserved_4 = false;
    opt.use_reserved_5 = false;
    opt.use_reserved_6 = false;
    opt.use_reserved_7 = false;
    Mat(&local_100,this->c,4,(Allocator *)0x0);
    operator=((Mat *)&opt,&local_100);
    ~Mat(&local_100);
    uVar4 = 0;
    uVar3 = (ulong)(uint)this->c;
    if (this->c < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      *(float *)(opt._0_8_ + uVar4 * 4) = -mean_vals[uVar4];
    }
    ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_100,(Mat *)&opt);
    (*pLVar2->_vptr_Layer[3])(pLVar2,&local_100);
  }
  else {
    if (mean_vals != (float *)0x0 || norm_vals == (float *)0x0) {
      if (mean_vals == (float *)0x0 || norm_vals == (float *)0x0) {
        return;
      }
      pLVar2 = create_layer(0x1d);
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,this->c);
      ParamDict::set(&pd,1,1);
      (*pLVar2->_vptr_Layer[2])(pLVar2,&pd);
      opt.workspace_allocator._0_4_ = 0;
      opt._20_8_ = 0;
      opt.lightmode = false;
      opt._1_3_ = 0;
      opt.num_threads = 0;
      opt.blob_allocator._0_4_ = 0;
      opt.blob_allocator._4_4_ = 0;
      opt.use_bf16_storage = false;
      opt.use_fp16_packed = false;
      opt.use_fp16_storage = false;
      opt.use_fp16_arithmetic = false;
      opt.use_int8_packed = false;
      opt.use_int8_storage = false;
      opt.use_int8_arithmetic = false;
      opt.use_packing_layout = false;
      opt.use_shader_pack8 = false;
      opt.use_subgroup_basic = false;
      opt.use_subgroup_vote = false;
      opt.use_subgroup_ballot = false;
      opt.use_subgroup_shuffle = false;
      opt.use_image_storage = false;
      opt.use_tensor_storage = false;
      opt.use_weight_fp16_storage = false;
      opt.flush_denormals = 0;
      opt.use_local_pool_allocator = false;
      opt.use_reserved_1 = false;
      opt.use_reserved_2 = false;
      opt.use_reserved_3 = false;
      opt.use_reserved_4 = false;
      opt.use_reserved_5 = false;
      opt.use_reserved_6 = false;
      opt.use_reserved_7 = false;
      MStack_70.cstep = 0;
      MStack_70.allocator = (Allocator *)0x0;
      MStack_70.dims = 0;
      MStack_70.w = 0;
      MStack_70.h = 0;
      MStack_70.d = 0;
      MStack_70.c = 0;
      MStack_70.data = (void *)0x0;
      MStack_70.refcount = (int *)0x0;
      MStack_70.elemsize = 0;
      MStack_70.elempack = 0;
      Mat(&local_100,this->c,4,(Allocator *)0x0);
      operator=((Mat *)&opt,&local_100);
      ~Mat(&local_100);
      Mat(&local_100,this->c,4,(Allocator *)0x0);
      operator=(&MStack_70,&local_100);
      ~Mat(&local_100);
      uVar4 = 0;
      uVar3 = (ulong)(uint)this->c;
      if (this->c < 1) {
        uVar3 = uVar4;
      }
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        fVar1 = norm_vals[uVar4];
        *(float *)(opt._0_8_ + uVar4 * 4) = fVar1;
        *(float *)((long)MStack_70.data + uVar4 * 4) = -mean_vals[uVar4] * fVar1;
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_100,(Mat *)&opt);
      (*pLVar2->_vptr_Layer[3])(pLVar2,&local_100);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_100);
      lVar5 = 0x48;
      do {
        ~Mat((Mat *)(&opt.lightmode + lVar5));
        lVar5 = lVar5 + -0x48;
      } while (lVar5 != -0x48);
      goto LAB_0013f092;
    }
    pLVar2 = create_layer(0x1d);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,this->c);
    (*pLVar2->_vptr_Layer[2])(pLVar2,&pd);
    opt.lightmode = false;
    opt._1_3_ = 0;
    opt.num_threads = 0;
    opt.blob_allocator._0_4_ = 0;
    opt.blob_allocator._4_4_ = 0;
    opt.workspace_allocator._0_4_ = 0;
    opt._20_8_ = 0;
    opt.use_bf16_storage = false;
    opt.use_fp16_packed = false;
    opt.use_fp16_storage = false;
    opt.use_fp16_arithmetic = false;
    opt.use_int8_packed = false;
    opt.use_int8_storage = false;
    opt.use_int8_arithmetic = false;
    opt.use_packing_layout = false;
    opt.use_shader_pack8 = false;
    opt.use_subgroup_basic = false;
    opt.use_subgroup_vote = false;
    opt.use_subgroup_ballot = false;
    opt.use_subgroup_shuffle = false;
    opt.use_image_storage = false;
    opt.use_tensor_storage = false;
    opt.use_weight_fp16_storage = false;
    opt.flush_denormals = 0;
    opt.use_local_pool_allocator = false;
    opt.use_reserved_1 = false;
    opt.use_reserved_2 = false;
    opt.use_reserved_3 = false;
    opt.use_reserved_4 = false;
    opt.use_reserved_5 = false;
    opt.use_reserved_6 = false;
    opt.use_reserved_7 = false;
    Mat(&local_100,this->c,4,(Allocator *)0x0);
    operator=((Mat *)&opt,&local_100);
    ~Mat(&local_100);
    uVar4 = 0;
    uVar3 = (ulong)(uint)this->c;
    if (this->c < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      *(float *)(opt._0_8_ + uVar4 * 4) = norm_vals[uVar4];
    }
    ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_100,(Mat *)&opt);
    (*pLVar2->_vptr_Layer[3])(pLVar2,&local_100);
  }
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_100);
  ~Mat((Mat *)&opt);
LAB_0013f092:
  ParamDict::~ParamDict(&pd);
  Option::Option(&opt);
  opt.num_threads = 1;
  (*pLVar2->_vptr_Layer[4])(pLVar2,&opt);
  (*pLVar2->_vptr_Layer[9])(pLVar2,this,&opt);
  (*pLVar2->_vptr_Layer[5])(pLVar2,&opt);
  (*pLVar2->_vptr_Layer[1])(pLVar2);
  return;
}

Assistant:

void Mat::substract_mean_normalize(const float* mean_vals, const float* norm_vals)
{
    Layer* op;

    if (mean_vals && !norm_vals)
    {
        // substract mean only
        op = create_layer(LayerType::Bias);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = -mean_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (!mean_vals && norm_vals)
    {
        // normalize only
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (mean_vals && norm_vals)
    {
        // substract mean and normalize
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);
        pd.set(1, 1);

        op->load_param(pd);

        Mat weights[2];
        weights[0] = Mat(c);
        weights[1] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = norm_vals[q];
            weights[1][q] = -mean_vals[q] * norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else // if (!mean_vals && !norm_vals)
    {
        return;
    }

    Option opt;
    opt.num_threads = 1; // TODO

    op->create_pipeline(opt);

    op->forward_inplace(*this, opt);

    op->destroy_pipeline(opt);

    delete op;
}